

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  FailureReporterInterface *pFVar1;
  ExpectationBase *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal *extraout_RDX_01;
  linked_ptr_internal lVar2;
  linked_ptr<testing::internal::ExpectationBase> *ptr;
  Expectation EVar3;
  long *local_30 [2];
  long local_20 [2];
  
  ptr = *(linked_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8)
  ;
  do {
    if (ptr == *(linked_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_) {
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,"Cannot find expectation.","");
      pFVar1 = GetFailureReporter();
      (*pFVar1->_vptr_FailureReporterInterface[2])
                (pFVar1,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/google/googlemock/src/gmock-spec-builders.cc"
                 ,0x1ca,local_30);
      lVar2.next_ = extraout_RDX;
      if (local_30[0] != local_20) {
        operator_delete(local_30[0],local_20[0] + 1);
        lVar2.next_ = extraout_RDX_00;
      }
      this->_vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
      this->mock_obj_ = &this->mock_obj_;
LAB_0012c9a3:
      EVar3.expectation_base_.link_.next_ = lVar2.next_;
      EVar3.expectation_base_.value_ = (ExpectationBase *)this;
      return (Expectation)EVar3.expectation_base_;
    }
    if (ptr->value_ == in_RDX) {
      linked_ptr<testing::internal::ExpectationBase>::linked_ptr
                ((linked_ptr<testing::internal::ExpectationBase> *)this,ptr);
      lVar2.next_ = extraout_RDX_01;
      goto LAB_0012c9a3;
    }
    ptr = ptr + 1;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}